

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

char * linenoise(char *prompt)

{
  ushort *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  ssize_t sVar8;
  size_t __n;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  char **ppcVar15;
  linenoiseState *plVar16;
  char cVar17;
  size_t i;
  long lVar18;
  byte local_10ca;
  char local_10c9;
  winsize ws;
  linenoiseState local_10c0;
  linenoiseCompletions lc;
  undefined1 local_1040 [8];
  char buf [4096];
  
  pcVar6 = getenv("TERM");
  if (pcVar6 == (char *)0x0) {
LAB_00131210:
    iVar13 = 0;
    iVar4 = isatty(0);
    if (iVar4 == 0) {
      pcVar6 = fgets(buf,0x1000,_stdin);
      if (pcVar6 != (char *)0x0) {
        sVar7 = strlen(buf);
        iVar4 = (int)sVar7;
        if (iVar4 != 0) {
          if (buf[iVar4 + -1] != '\n') goto LAB_0013182d;
          buf[iVar4 + -1] = '\0';
        }
        goto LAB_00131832;
      }
    }
    else {
      iVar4 = enableRawMode(iVar13);
      if (iVar4 != -1) {
        local_10c0.ifd = 0;
        local_10c0.ofd = 1;
        local_10c0.buf = buf;
        local_10c0.prompt = prompt;
        sVar7 = strlen(prompt);
        local_10c0.pos = 0;
        local_10c0.oldpos = 0;
        local_10c0.len = 0;
        iVar13 = 0x5413;
        iVar14 = 1;
        local_10c0.plen = sVar7;
        iVar4 = ioctl(1,0x5413,&ws);
        if (ws.ws_col == 0 || iVar4 == -1) {
          iVar4 = getCursorPosition(iVar14,iVar13);
          uVar11 = 0x50;
          if (iVar4 != -1) {
            iVar13 = 0x13ea19;
            iVar14 = 1;
            sVar8 = write(1,"\x1b[999C",6);
            if (((sVar8 == 6) && (uVar5 = getCursorPosition(iVar14,iVar13), uVar5 != 0xffffffff)) &&
               (uVar11 = uVar5, iVar4 < (int)uVar5)) {
              snprintf((char *)&lc,0x20,"\x1b[%dD");
              __n = strlen((char *)&lc);
              write(1,&lc,__n);
            }
          }
        }
        else {
          uVar11 = (uint)ws.ws_col;
        }
        local_10c0.cols = (size_t)(int)uVar11;
        local_10c0.maxrows = 0;
        local_10c0.history_index = 0;
        buf[0] = '\0';
        local_10c0.buflen = 0xfff;
        linenoiseHistoryAdd("");
        iVar13 = 1;
        sVar8 = write(1,prompt,sVar7);
        if (sVar8 == -1) {
LAB_0013181d:
          iVar4 = -1;
        }
        else {
          iVar13 = 0;
          while (sVar8 = read(iVar13,&local_10ca,1), 0 < (int)sVar8) {
            uVar11 = (uint)local_10ca;
            if (completionCallback != (linenoiseCompletionCallback *)0x0 && local_10ca == 9) {
              lc.len = 0;
              lc.cvec = (char **)0x0;
              local_10c9 = '\0';
              (*completionCallback)(local_10c0.buf,&lc);
              if (lc.len != 0) {
                cVar17 = '\0';
                uVar10 = 0;
                do {
                  bVar12 = true;
                  while( true ) {
                    while( true ) {
                      sVar3 = local_10c0.len;
                      sVar2 = local_10c0.pos;
                      if (!bVar12) {
                        uVar11 = (uint)cVar17;
                        goto LAB_00131581;
                      }
                      if (uVar10 < lc.len) {
                        local_1040 = (undefined1  [8])local_10c0.buf;
                        pcVar6 = lc.cvec[uVar10];
                        local_10c0.pos = strlen(pcVar6);
                        local_10c0.buf = pcVar6;
                        local_10c0.len = local_10c0.pos;
                        refreshLine(&local_10c0);
                        local_10c0.buf = (char *)local_1040;
                        local_10c0.pos = sVar2;
                        local_10c0.len = sVar3;
                      }
                      else {
                        refreshLine(&local_10c0);
                      }
                      sVar8 = read(local_10c0.ifd,&local_10c9,1);
                      sVar2 = lc.len;
                      cVar17 = local_10c9;
                      if ((int)sVar8 < 1) {
                        uVar11 = 0xffffffff;
                        goto LAB_00131581;
                      }
                      if (local_10c9 != '\x1b') break;
                      bVar12 = false;
                      if (uVar10 < lc.len) {
                        refreshLine(&local_10c0);
                        bVar12 = false;
                      }
                    }
                    if (local_10c9 == '\t') break;
                    bVar12 = false;
                    if (uVar10 < lc.len) {
                      bVar12 = false;
                      iVar4 = snprintf(local_10c0.buf,local_10c0.buflen,"%s",lc.cvec[uVar10]);
                      local_10c0.pos = (size_t)iVar4;
                      local_10c0.len = local_10c0.pos;
                    }
                  }
                  uVar10 = (uVar10 + 1) % (lc.len + 1);
                  if (uVar10 == lc.len) {
                    linenoiseBeep();
                    uVar10 = sVar2;
                  }
                } while( true );
              }
              linenoiseBeep();
              uVar11 = 0;
LAB_00131581:
              for (uVar10 = 0; uVar10 < lc.len; uVar10 = uVar10 + 1) {
                free(lc.cvec[uVar10]);
              }
              ppcVar15 = lc.cvec;
              free(lc.cvec);
              iVar13 = (int)ppcVar15;
              if (-1 < (int)uVar11) {
                if (uVar11 != 0) goto LAB_001315b6;
                goto switchD_0013176e_caseD_45;
              }
              break;
            }
LAB_001315b6:
            switch(uVar11 & 0xff) {
            case 1:
switchD_001315cf_caseD_1:
              linenoiseEditMoveHome(&local_10c0);
              break;
            case 2:
switchD_001315cf_caseD_2:
              linenoiseEditMoveLeft(&local_10c0);
              break;
            case 3:
              piVar9 = __errno_location();
              *piVar9 = 0xb;
              goto LAB_0013181d;
            case 4:
              if (local_10c0.len == 0) {
                lVar18 = (long)history_len;
                history_len = history_len + -1;
                pcVar6 = history[lVar18 + -1];
                free(pcVar6);
                iVar13 = (int)pcVar6;
                goto LAB_0013181d;
              }
LAB_001316c8:
              linenoiseEditDelete(&local_10c0);
              break;
            case 5:
switchD_001315cf_caseD_5:
              linenoiseEditMoveEnd(&local_10c0);
              break;
            case 6:
switchD_001315cf_caseD_6:
              linenoiseEditMoveRight(&local_10c0);
              break;
            case 7:
            case 9:
            case 10:
            case 0xf:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
              goto switchD_001315cf_caseD_7;
            case 8:
switchD_001315cf_caseD_8:
              linenoiseEditBackspace(&local_10c0);
              break;
            case 0xb:
              buf[local_10c0.pos] = '\0';
              local_10c0.len = local_10c0.pos;
              goto LAB_001316e9;
            case 0xc:
              linenoiseClearScreen();
              goto LAB_001316e9;
            case 0xd:
              lVar18 = (long)history_len;
              history_len = history_len + -1;
              pcVar6 = history[lVar18 + -1];
              free(pcVar6);
              iVar13 = (int)pcVar6;
              if (mlmode != 0) {
                plVar16 = &local_10c0;
                linenoiseEditMoveEnd(plVar16);
                iVar13 = (int)plVar16;
              }
              goto LAB_001317f5;
            case 0xe:
switchD_001315cf_caseD_e:
              iVar4 = 0;
              goto LAB_001317a5;
            case 0x10:
switchD_001315cf_caseD_10:
              iVar4 = 1;
LAB_001317a5:
              linenoiseEditHistoryNext(&local_10c0,iVar4);
              break;
            case 0x14:
              if (local_10c0.pos < local_10c0.len && local_10c0.pos != 0) {
                puVar1 = (ushort *)(buf + (local_10c0.pos - 1));
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                if (local_10c0.pos != local_10c0.len - 1) {
                  local_10c0.pos = local_10c0.pos + 1;
                }
                goto LAB_001316e9;
              }
              break;
            case 0x15:
              local_10c0.len = 0;
              buf[0] = '\0';
              local_10c0.pos = 0;
LAB_001316e9:
              refreshLine(&local_10c0);
              break;
            case 0x17:
              linenoiseEditDeletePrevWord(&local_10c0);
              break;
            case 0x1b:
              iVar4 = local_10c0.ifd;
              sVar8 = read(local_10c0.ifd,&ws,1);
              if ((sVar8 != -1) &&
                 (sVar8 = read(iVar4,(void *)((long)&ws.ws_row + 1),1), sVar8 != -1)) {
                if ((char)ws.ws_row == 'O') {
                  if (ws.ws_row._1_1_ == 'F') goto switchD_001315cf_caseD_5;
                  if (ws.ws_row._1_1_ == 'H') goto switchD_001315cf_caseD_1;
                }
                else if ((char)ws.ws_row == '[') {
                  if ((byte)(ws.ws_row._1_1_ - 0x30U) < 10) {
                    sVar8 = read(iVar4,&ws.ws_col,1);
                    if (((sVar8 != -1) && ((char)ws.ws_col == '~')) && (ws.ws_row._1_1_ == '3'))
                    goto LAB_001316c8;
                  }
                  else {
                    switch(ws.ws_row._1_1_) {
                    case 'A':
                      goto switchD_001315cf_caseD_10;
                    case 'B':
                      goto switchD_001315cf_caseD_e;
                    case 'C':
                      goto switchD_001315cf_caseD_6;
                    case 'D':
                      goto switchD_001315cf_caseD_2;
                    case 'F':
                      goto switchD_001315cf_caseD_5;
                    case 'H':
                      goto switchD_001315cf_caseD_1;
                    }
                  }
                }
              }
              break;
            default:
              if ((uVar11 & 0xff) == 0x7f) goto switchD_001315cf_caseD_8;
switchD_001315cf_caseD_7:
              plVar16 = &local_10c0;
              iVar4 = linenoiseEditInsert(plVar16,(char)uVar11);
              iVar13 = (int)plVar16;
              if (iVar4 != 0) goto LAB_0013181d;
            }
switchD_0013176e_caseD_45:
            iVar13 = local_10c0.ifd;
          }
LAB_001317f5:
          iVar4 = (int)local_10c0.len;
        }
        disableRawMode(iVar13);
        putchar(10);
LAB_0013182d:
        if (iVar4 != -1) goto LAB_00131832;
      }
    }
    pcVar6 = (char *)0x0;
  }
  else {
    lVar18 = 0;
    do {
      if (lVar18 == 0x18) goto LAB_00131210;
      iVar4 = strcasecmp(pcVar6,*(char **)((long)unsupported_term + lVar18));
      lVar18 = lVar18 + 8;
    } while (iVar4 != 0);
    printf("%s",prompt);
    fflush(_stdout);
    pcVar6 = fgets(buf,0x1000,_stdin);
    if (pcVar6 == (char *)0x0) {
      return (char *)0x0;
    }
    sVar7 = strlen(buf);
    while ((sVar7 != 0 && ((buf[sVar7 - 1] == '\r' || (buf[sVar7 - 1] == '\n'))))) {
      buf[sVar7 - 1] = '\0';
      sVar7 = sVar7 - 1;
    }
LAB_00131832:
    pcVar6 = strdup(buf);
  }
  return pcVar6;
}

Assistant:

char *linenoise(const char *prompt) {
	char buf[LINENOISE_MAX_LINE];
	int count;

	if (isUnsupportedTerm()) {
		size_t len;

		printf("%s",prompt);
		fflush(stdout);
		if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
		len = strlen(buf);
		while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
			len--;
			buf[len] = '\0';
		}
		return strdup(buf);
	} else {
		count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
		if (count == -1) return NULL;
		return strdup(buf);
	}
}